

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O1

void ipc_listener_doaccept(ipc_listener *l)

{
  int iVar1;
  nng_err result;
  nni_aio *aio;
  int *piVar2;
  bool bVar3;
  nni_ipc_conn *local_40;
  nni_ipc_conn *c;
  
  aio = (nni_aio *)nni_list_first(&l->acceptq);
  if (aio != (nni_aio *)0x0) {
    c = (nni_ipc_conn *)&l->sa;
    do {
      iVar1 = nni_posix_pfd_fd(&l->pfd);
      iVar1 = accept(iVar1,(sockaddr *)0x0,(socklen_t *)0x0);
      if (iVar1 < 0) {
        piVar2 = __errno_location();
        iVar1 = *piVar2;
        bVar3 = false;
        if (1 < iVar1 - 0x67U) {
          if (iVar1 != 0xb) {
            result = nni_plat_errno(iVar1);
            if (result == NNG_OK) {
              nni_panic("%s: %d: assert err: %s",
                        "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_ipclisten.c"
                        ,0x81,"rv != 0");
            }
            nni_aio_list_remove(aio);
            goto LAB_00136010;
          }
          bVar3 = true;
          result = nni_posix_pfd_arm(&l->pfd,1);
          if (result != NNG_OK) goto LAB_00136003;
        }
      }
      else {
        result = nni_posix_ipc_alloc(&local_40,(nni_sockaddr *)c,(nni_ipc_dialer *)0x0,iVar1);
        if (result == NNG_OK) {
          nni_aio_list_remove(aio);
          bVar3 = false;
          nni_aio_set_output(aio,0,local_40);
          nni_aio_finish(aio,NNG_OK,0);
        }
        else {
          close(iVar1);
LAB_00136003:
          nni_aio_list_remove(aio);
LAB_00136010:
          nni_aio_finish_error(aio,result);
          bVar3 = false;
        }
      }
    } while ((!bVar3) && (aio = (nni_aio *)nni_list_first(&l->acceptq), aio != (nni_aio *)0x0));
  }
  return;
}

Assistant:

static void
ipc_listener_doaccept(ipc_listener *l)
{
	nni_aio *aio;

	while ((aio = nni_list_first(&l->acceptq)) != NULL) {
		int           newfd;
		int           fd;
		int           rv;
		nni_ipc_conn *c;

		fd = nni_posix_pfd_fd(&l->pfd);

#ifdef NNG_USE_ACCEPT4
		newfd = accept4(fd, NULL, NULL, SOCK_CLOEXEC);
		if ((newfd < 0) && ((errno == ENOSYS) || (errno == ENOTSUP))) {
			newfd = accept(fd, NULL, NULL);
		}
#else
		newfd = accept(fd, NULL, NULL);
#endif
		if (newfd < 0) {
			switch (errno) {
			case EAGAIN:
#ifdef EWOULDBLOCK
#if EWOULDBLOCK != EAGAIN
			case EWOULDBLOCK:
#endif
#endif
				rv = nni_posix_pfd_arm(&l->pfd, NNI_POLL_IN);
				if (rv != 0) {
					nni_aio_list_remove(aio);
					nni_aio_finish_error(aio, rv);
					continue;
				}
				// Come back later...
				return;
			case ECONNABORTED:
			case ECONNRESET:
				// Eat them, they aren't interesting.
				continue;
			default:
				// Error this one, but keep moving to the next.
				rv = nni_plat_errno(errno);
				NNI_ASSERT(rv != 0);
				nni_aio_list_remove(aio);
				nni_aio_finish_error(aio, rv);
				continue;
			}
		}

		if ((rv = nni_posix_ipc_alloc(&c, &l->sa, NULL, newfd)) != 0) {
			(void) close(newfd);
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, rv);
			continue;
		}

		nni_aio_list_remove(aio);
		nni_aio_set_output(aio, 0, c);
		nni_aio_finish(aio, 0, 0);
	}
}